

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_TypedPrintToTest_x_iutest_x_Print_Test<long>::Body
          (iu_TypedPrintToTest_x_iutest_x_Print_Test<long> *this)

{
  long *v;
  TypeParam_conflict7 d;
  TypeParam_conflict7 c;
  TypeParam_conflict7 a;
  iuCodeMessage local_260;
  undefined8 local_230;
  long local_228 [2];
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  iuStreamMessage local_198;
  
  local_228[1] = 0;
  local_228[0] = 0;
  local_230 = 0;
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  iutest::PrintToString<long>(&local_1b8,local_228 + 1);
  iutest::detail::iuStreamMessage::operator<<(&local_198,&local_1b8);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_260,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3db,"Succeeded.\n");
  local_260._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_260,(Fixed *)&local_198);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_1b8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  iutest::PrintToString<long>(&local_1d8,local_228 + 1);
  iutest::detail::iuStreamMessage::operator<<(&local_198,&local_1d8);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_260,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3dc,"Succeeded.\n");
  local_260._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_260,(Fixed *)&local_198);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_1d8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  iutest::PrintToString<long>(&local_1f8,local_228);
  iutest::detail::iuStreamMessage::operator<<(&local_198,&local_1f8);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_260,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3dd,"Succeeded.\n");
  local_260._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_260,(Fixed *)&local_198);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_1f8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
  iutest::PrintToString<long_volatile>(&local_218,(iutest *)&local_230,v);
  iutest::detail::iuStreamMessage::operator<<(&local_198,&local_218);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_260,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3de,"Succeeded.\n");
  local_260._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_260,(Fixed *)&local_198);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_218);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedPrintToTest, Print)
{
    TypeParam a = 0;
    TypeParam& b = a;
    const TypeParam c = a;
    const volatile TypeParam d = a;

    IUTEST_SUCCEED() << ::iutest::PrintToString(a);
    IUTEST_SUCCEED() << ::iutest::PrintToString(b);
    IUTEST_SUCCEED() << ::iutest::PrintToString(c);
    IUTEST_SUCCEED() << ::iutest::PrintToString(d);
}